

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O2

int drm_ioctl(int fd,int req,void *arg)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  
  do {
    uVar1 = ioctl(fd,(long)req,arg);
    if (uVar1 != 0xffffffff) break;
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (*piVar2 == 0xb));
  if (((byte)drm_debug & 4) != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _mpp_log_l(4,"mpp_drm","%x ret %d: %s\n","drm_ioctl",req,(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

static int drm_ioctl(int fd, int req, void *arg)
{
    int ret;

    do {
        ret = ioctl(fd, req, arg);
    } while (ret == -1 && (errno == EINTR || errno == EAGAIN));

    drm_dbg_ioctl("%x ret %d: %s\n", req, ret, strerror(errno));

    return ret;
}